

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

void __thiscall FIX::Dictionary::Dictionary(Dictionary *this,string *name)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  this->_vptr_Dictionary = (_func_int **)&PTR__Dictionary_001f8500;
  p_Var1 = &(this->m_data)._M_t._M_impl.super__Rb_tree_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + name->_M_string_length);
  return;
}

Assistant:

Dictionary(const std::string &name)
      : m_name(name) {}